

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreTexture.h
# Opt level: O3

void __thiscall
irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>::~COpenGLCoreTexture
          (COpenGLCoreTexture<irr::video::COpenGLDriver> *this,void **vtt)

{
  code *pcVar1;
  _func_int **pp_Var2;
  IImage *pIVar3;
  pointer pcVar4;
  _func_int *p_Var5;
  pointer ppIVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  pointer ppIVar8;
  ulong uVar9;
  
  pp_Var2 = (_func_int **)*vtt;
  (this->super_ITexture)._vptr_ITexture = pp_Var2;
  *(void **)((long)&(this->super_ITexture)._vptr_ITexture + (long)pp_Var2[-3]) = vtt[3];
  if (*(int *)&(this->super_ITexture).field_0x84 != 0) {
    (*GL.DeleteTextures)(1,(GLuint *)&(this->super_ITexture).field_0x84);
  }
  pIVar3 = this->LockImage;
  if (pIVar3 != (IImage *)0x0) {
    p_Var5 = pIVar3->_vptr_IImage[-3];
    pcVar1 = p_Var5 + 4 + (long)&(pIVar3->Size).Width;
    *(int *)pcVar1 = *(int *)pcVar1 + -1;
    if (*(int *)pcVar1 == 0) {
      (**(code **)(*(long *)((long)&pIVar3->_vptr_IImage + (long)p_Var5) + 8))();
    }
  }
  ppIVar8 = (this->Images).m_data.
            super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppIVar6 = (this->Images).m_data.
            super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((int)((ulong)((long)ppIVar6 - (long)ppIVar8) >> 3) != 0) {
    uVar9 = 0;
    do {
      pIVar3 = ppIVar8[uVar9];
      p_Var5 = pIVar3->_vptr_IImage[0xfffffffffffffffd];
      pcVar1 = p_Var5 + 4 + (long)&(pIVar3->Size).Width;
      *(int *)pcVar1 = *(int *)pcVar1 + -1;
      if (*(int *)pcVar1 == 0) {
        p_Var5 = (_func_int *)((long)&pIVar3->_vptr_IImage + (long)p_Var5);
        (**(code **)(*(long *)p_Var5 + 8))(p_Var5);
        ppIVar8 = (this->Images).m_data.
                  super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppIVar6 = (this->Images).m_data.
                  super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < ((ulong)((long)ppIVar6 - (long)ppIVar8) >> 3 & 0xffffffff));
  }
  if (ppIVar8 != (pointer)0x0) {
    operator_delete(ppIVar8,(long)(this->Images).m_data.
                                  super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppIVar8
                   );
  }
  pp_Var2 = (_func_int **)vtt[1];
  (this->super_ITexture)._vptr_ITexture = pp_Var2;
  *(void **)((long)&(this->super_ITexture)._vptr_ITexture + (long)pp_Var2[-3]) = vtt[2];
  pcVar4 = (this->super_ITexture).NamedPath.InternalName.str._M_dataplus._M_p;
  paVar7 = &(this->super_ITexture).NamedPath.InternalName.str.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar7) {
    operator_delete(pcVar4,paVar7->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->super_ITexture).NamedPath.Path.str._M_dataplus._M_p;
  paVar7 = &(this->super_ITexture).NamedPath.Path.str.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar7) {
    operator_delete(pcVar4,paVar7->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~COpenGLCoreTexture()
	{
		if (TextureName)
			GL.DeleteTextures(1, &TextureName);

		if (LockImage)
			LockImage->drop();

		for (u32 i = 0; i < Images.size(); ++i)
			Images[i]->drop();
	}